

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

Literal * __thiscall
wasm::Literal::relaxedNmaddF64x2
          (Literal *__return_storage_ptr__,Literal *this,Literal *left,Literal *right)

{
  Type *this_00;
  bool bVar1;
  bool bVar2;
  Literal *this_01;
  long lVar3;
  Literal *this_02;
  Literal *left_00;
  Literal *right_00;
  undefined1 local_138 [8];
  LaneArray<2> x;
  LaneArray<2> y;
  LaneArray<2> z;
  Literal local_90;
  undefined1 auStack_78 [8];
  LaneArray<2> r;
  
  this_02 = (Literal *)local_138;
  getLanesF64x2((LaneArray<2> *)this_02,this);
  left_00 = (Literal *)&x._M_elems[1].type;
  getLanesF64x2((LaneArray<2> *)left_00,left);
  right_00 = (Literal *)&y._M_elems[1].type;
  getLanesF64x2((LaneArray<2> *)right_00,right);
  r._M_elems[1].field_0.i64 = 0;
  r._M_elems[1].field_0.func.super_IString.str._M_str = (char *)0x0;
  r._M_elems[0].field_0.func.super_IString.str._M_str = (char *)0x0;
  r._M_elems[0].type.id = 0;
  auStack_78 = (undefined1  [8])0x0;
  r._M_elems[0].field_0.i64 = 0;
  this_01 = (Literal *)auStack_78;
  bVar2 = true;
  do {
    bVar1 = bVar2;
    nmadd(&local_90,this_02,left_00,right_00);
    this_00 = &z._M_elems[1].type;
    Literal((Literal *)this_00,&local_90);
    ~Literal(this_01);
    Literal(this_01,(Literal *)this_00);
    ~Literal((Literal *)this_00);
    ~Literal(&local_90);
    this_01 = (Literal *)&r._M_elems[0].type;
    right_00 = (Literal *)&z._M_elems[0].type;
    left_00 = (Literal *)&y._M_elems[0].type;
    this_02 = (Literal *)&x._M_elems[0].type;
    bVar2 = false;
  } while (bVar1);
  Literal(__return_storage_ptr__,(LaneArray<2> *)auStack_78);
  lVar3 = 0x18;
  do {
    ~Literal((Literal *)((long)r._M_elems + lVar3 + -8));
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  lVar3 = 0x18;
  do {
    ~Literal((Literal *)((long)&y._M_elems[1].type.id + lVar3));
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  lVar3 = 0x18;
  do {
    ~Literal((Literal *)((long)&x._M_elems[1].type.id + lVar3));
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  lVar3 = 0x18;
  do {
    ~Literal((Literal *)(local_138 + lVar3));
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::relaxedNmaddF64x2(const Literal& left,
                                   const Literal& right) const {
  return ternary<2, &Literal::getLanesF64x2, &Literal::nmadd>(
    *this, left, right);
}